

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<true,true>>::
     consumeMessage<14u,unsigned_long>
               (unsigned_long payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  OpCode OVar9;
  bool bVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  
  bVar1 = *(byte *)&wState->state;
  OVar9 = **src & 0xf;
  if (OVar9 == 0) {
    if ((bVar1 & 0x60) == 0x60) goto LAB_0014d010;
  }
  else {
    if (((bVar1 & 0x60) == 0x20) || (OVar9 == TEXT && -1 < (char)bVar1)) goto LAB_0014d010;
    bVar12 = (bVar1 >> 5) + 1;
    *(byte *)&wState->state = bVar1 & 0x9f | (bVar12 & 3) << 5;
    (wState->state).opCode[(long)((ulong)bVar12 << 0x3e) >> 0x3e] = OVar9;
  }
  *(byte *)&wState->state = *(byte *)&wState->state & 0x7f | **src & 0x80U;
  us_socket_context(1,user);
  lVar11 = us_socket_context_ext(1);
  if (payLength <= *(ulong *)(lVar11 + 0xa0)) {
    uVar14 = payLength + 0xe;
    if (*length < uVar14) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = ((int)payLength - *length) + 0xe;
      bVar1 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 10);
      pcVar8 = *src;
      uVar7 = *length;
      lVar11 = 0;
      do {
        pcVar8[lVar11 * 4] = wState->mask[0] ^ pcVar8[lVar11 * 4 + 0xe];
        pcVar8[lVar11 * 4 + 1] = wState->mask[1] ^ pcVar8[lVar11 * 4 + 0xf];
        pcVar8[lVar11 * 4 + 2] = wState->mask[2] ^ pcVar8[lVar11 * 4 + 0x10];
        pcVar8[lVar11 * 4 + 3] = wState->mask[3] ^ pcVar8[lVar11 * 4 + 0x11];
        lVar11 = lVar11 + 1;
      } while ((uVar7 - 0xe >> 2) + 1 != (int)lVar11);
      uVar7 = *length;
      uVar13 = uVar7 ^ 2;
      cVar2 = wState->mask[1];
      cVar3 = wState->mask[2];
      cVar4 = wState->mask[3];
      uVar14 = (ulong)(-uVar13 & 3);
      wState->mask[uVar14] = wState->mask[0];
      wState->mask[1 - uVar13 & 3] = cVar2;
      wState->mask[uVar14 ^ 2] = cVar3;
      wState->mask[(ulong)(uVar7 & 3) ^ 1] = cVar4;
      WebSocketContext<true,_true>::handleFragment
                (*src,(ulong)(*length - 0xe),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar1 >> 7),wState,user);
      return true;
    }
    pcVar8 = *src;
    bVar1 = pcVar8[10];
    bVar12 = pcVar8[0xb];
    bVar5 = pcVar8[0xc];
    bVar6 = pcVar8[0xd];
    lVar11 = 0;
    do {
      pcVar8[lVar11 * 4 + 10] = pcVar8[lVar11 * 4 + 0xe] ^ bVar1;
      pcVar8[lVar11 * 4 + 0xb] = pcVar8[lVar11 * 4 + 0xf] ^ bVar12;
      pcVar8[lVar11 * 4 + 0xc] = pcVar8[lVar11 * 4 + 0x10] ^ bVar5;
      pcVar8[lVar11 * 4 + 0xd] = pcVar8[lVar11 * 4 + 0x11] ^ bVar6;
      lVar11 = lVar11 + 1;
    } while (((uint)(payLength >> 2) & 0x3fffffff) + 1 != (int)lVar11);
    bVar10 = WebSocketContext<true,_true>::handleFragment
                       (*src + 10,payLength,0,
                        (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                        (bool)((byte)**src >> 7),wState,user);
    if (!bVar10) {
      if (**src < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
      }
      *src = *src + uVar14;
      *length = *length - (int)uVar14;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_0014d010:
  us_socket_close(1,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }